

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

LoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopStatementSyntax,slang::syntax::LoopStatementSyntax_const&>
          (BumpAllocator *this,LoopStatementSyntax *args)

{
  LoopStatementSyntax *this_00;
  
  this_00 = (LoopStatementSyntax *)allocate(this,0x98,8);
  slang::syntax::LoopStatementSyntax::LoopStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }